

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O0

void __thiscall btSoftBody::applyClusters(btSoftBody *this,bool drift)

{
  Node *pNVar1;
  float fVar2;
  int iVar3;
  int iVar4;
  Cluster **ppCVar5;
  Node **ppNVar6;
  Node *pNVar7;
  float *pfVar8;
  btVector3 *this_00;
  byte in_SIL;
  long in_RDI;
  btVector3 bVar9;
  btScalar q;
  btVector3 *x;
  int idx;
  int j;
  btVector3 w;
  btVector3 v;
  Cluster *c_1;
  Cluster *c;
  int i;
  btAlignedObjectArray<float> weights;
  btAlignedObjectArray<btVector3> deltas;
  CProfileSample __profile;
  btVector3 *in_stack_fffffffffffffd28;
  Node *in_stack_fffffffffffffd30;
  undefined1 in_stack_fffffffffffffd38 [16];
  undefined1 in_stack_fffffffffffffd48 [16];
  undefined1 auVar10 [12];
  btScalar local_258;
  btScalar bStack_254;
  btScalar local_238;
  btScalar bStack_234;
  btScalar local_218;
  btScalar bStack_214;
  btScalar local_1f8;
  btScalar bStack_1f4;
  btScalar local_1a8;
  btScalar bStack_1a4;
  btScalar local_178;
  btScalar bStack_174;
  int local_15c;
  btVector3 local_124;
  btScalar local_114;
  btScalar bStack_110;
  undefined8 local_10c;
  btScalar local_104;
  btScalar bStack_100;
  undefined8 local_fc;
  btScalar local_f4;
  btScalar bStack_f0;
  undefined8 local_ec;
  btVector3 local_e4;
  float local_d4;
  btVector3 *local_d0;
  int local_c8;
  int local_c4;
  btScalar local_c0;
  btScalar bStack_bc;
  undefined8 local_b8;
  btScalar local_b0;
  btScalar bStack_ac;
  undefined8 local_a8;
  Cluster *local_a0;
  float local_98;
  float local_94;
  Cluster *local_90;
  int local_84;
  undefined4 local_80;
  btScalar local_7c;
  btScalar local_78;
  btScalar local_74;
  btVector3 local_70;
  btAlignedObjectArray<float> local_60;
  btAlignedObjectArray<btVector3> local_30;
  byte local_9;
  
  auVar10 = in_stack_fffffffffffffd48._4_12_;
  local_9 = in_SIL & 1;
  CProfileSample::CProfileSample
            ((CProfileSample *)in_stack_fffffffffffffd30,(char *)in_stack_fffffffffffffd28);
  btAlignedObjectArray<btVector3>::btAlignedObjectArray
            ((btAlignedObjectArray<btVector3> *)in_stack_fffffffffffffd30);
  btAlignedObjectArray<float>::btAlignedObjectArray
            ((btAlignedObjectArray<float> *)in_stack_fffffffffffffd30);
  btAlignedObjectArray<btSoftBody::Node>::size
            ((btAlignedObjectArray<btSoftBody::Node> *)(in_RDI + 0x370));
  local_74 = 0.0;
  local_78 = 0.0;
  local_7c = 0.0;
  btVector3::btVector3(&local_70,&local_74,&local_78,&local_7c);
  btAlignedObjectArray<btVector3>::resize
            (auVar10._4_8_,auVar10._0_4_,in_stack_fffffffffffffd38._8_8_);
  btAlignedObjectArray<btSoftBody::Node>::size
            ((btAlignedObjectArray<btSoftBody::Node> *)(in_RDI + 0x370));
  local_80 = 0;
  btAlignedObjectArray<float>::resize(auVar10._4_8_,auVar10._0_4_,in_stack_fffffffffffffd38._8_8_);
  if ((local_9 & 1) != 0) {
    for (local_84 = 0; iVar3 = local_84,
        iVar4 = btAlignedObjectArray<btSoftBody::Cluster_*>::size
                          ((btAlignedObjectArray<btSoftBody::Cluster_*> *)(in_RDI + 0x5d8)),
        iVar3 < iVar4; local_84 = local_84 + 1) {
      ppCVar5 = btAlignedObjectArray<btSoftBody::Cluster_*>::operator[]
                          ((btAlignedObjectArray<btSoftBody::Cluster_*> *)(in_RDI + 0x5d8),local_84)
      ;
      local_90 = *ppCVar5;
      if (local_90->m_ndimpulses != 0) {
        local_94 = (float)local_90->m_ndimpulses;
        btVector3::operator/=
                  ((btVector3 *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28->m_floats);
        local_98 = (float)local_90->m_ndimpulses;
        btVector3::operator/=
                  ((btVector3 *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28->m_floats);
      }
    }
  }
  for (local_84 = 0; iVar3 = local_84,
      iVar4 = btAlignedObjectArray<btSoftBody::Cluster_*>::size
                        ((btAlignedObjectArray<btSoftBody::Cluster_*> *)(in_RDI + 0x5d8)),
      iVar3 < iVar4; local_84 = local_84 + 1) {
    ppCVar5 = btAlignedObjectArray<btSoftBody::Cluster_*>::operator[]
                        ((btAlignedObjectArray<btSoftBody::Cluster_*> *)(in_RDI + 0x5d8),local_84);
    local_a0 = *ppCVar5;
    if ((local_9 & 1) == 0) {
      local_15c = local_a0->m_nvimpulses;
    }
    else {
      local_15c = local_a0->m_ndimpulses;
    }
    if (0 < local_15c) {
      bVar9 = ::operator*(in_stack_fffffffffffffd38._8_8_,in_stack_fffffffffffffd38._0_8_);
      local_a8 = bVar9.m_floats._8_8_;
      local_178 = bVar9.m_floats[0];
      bStack_174 = bVar9.m_floats[1];
      local_b0 = local_178;
      bStack_ac = bStack_174;
      bVar9 = ::operator*(in_stack_fffffffffffffd38._8_8_,in_stack_fffffffffffffd38._0_8_);
      local_b8 = bVar9.m_floats._8_8_;
      local_1a8 = bVar9.m_floats[0];
      bStack_1a4 = bVar9.m_floats[1];
      local_c0 = local_1a8;
      bStack_bc = bStack_1a4;
      for (local_c4 = 0; iVar3 = local_c4,
          iVar4 = btAlignedObjectArray<btSoftBody::Node_*>::size(&local_a0->m_nodes), iVar3 < iVar4;
          local_c4 = local_c4 + 1) {
        ppNVar6 = btAlignedObjectArray<btSoftBody::Node_*>::operator[](&local_a0->m_nodes,local_c4);
        pNVar1 = *ppNVar6;
        pNVar7 = btAlignedObjectArray<btSoftBody::Node>::operator[]
                           ((btAlignedObjectArray<btSoftBody::Node> *)(in_RDI + 0x370),0);
        local_c8 = (int)((ulong)((long)pNVar1 - (long)pNVar7) >> 3) * -0x11111111;
        ppNVar6 = btAlignedObjectArray<btSoftBody::Node_*>::operator[](&local_a0->m_nodes,local_c4);
        local_d0 = &(*ppNVar6)->m_x;
        pfVar8 = btAlignedObjectArray<float>::operator[](&local_a0->m_masses,local_c4);
        local_d4 = *pfVar8;
        bVar9 = operator-(in_stack_fffffffffffffd38._8_8_,in_stack_fffffffffffffd38._0_8_);
        local_10c = bVar9.m_floats._8_8_;
        local_1f8 = bVar9.m_floats[0];
        bStack_1f4 = bVar9.m_floats[1];
        local_114 = local_1f8;
        bStack_110 = bStack_1f4;
        bVar9 = btCross((btVector3 *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
        local_fc = bVar9.m_floats._8_8_;
        local_218 = bVar9.m_floats[0];
        bStack_214 = bVar9.m_floats[1];
        local_104 = local_218;
        bStack_100 = bStack_214;
        bVar9 = operator+(in_stack_fffffffffffffd38._8_8_,in_stack_fffffffffffffd38._0_8_);
        local_ec = bVar9.m_floats._8_8_;
        local_238 = bVar9.m_floats[0];
        bStack_234 = bVar9.m_floats[1];
        local_f4 = local_238;
        bStack_f0 = bStack_234;
        bVar9 = ::operator*(in_stack_fffffffffffffd38._8_8_,in_stack_fffffffffffffd38._0_8_);
        local_e4.m_floats._8_8_ = bVar9.m_floats._8_8_;
        local_258 = bVar9.m_floats[0];
        bStack_254 = bVar9.m_floats[1];
        local_e4.m_floats[0] = local_258;
        local_e4.m_floats[1] = bStack_254;
        this_00 = btAlignedObjectArray<btVector3>::operator[](&local_30,local_c8);
        btVector3::operator+=(this_00,&local_e4);
        fVar2 = local_d4;
        pfVar8 = btAlignedObjectArray<float>::operator[](&local_60,local_c8);
        *pfVar8 = fVar2 + *pfVar8;
      }
    }
  }
  for (local_84 = 0; iVar3 = local_84, iVar4 = btAlignedObjectArray<btVector3>::size(&local_30),
      iVar3 < iVar4; local_84 = local_84 + 1) {
    pfVar8 = btAlignedObjectArray<float>::operator[](&local_60,local_84);
    if (0.0 < *pfVar8) {
      btAlignedObjectArray<btVector3>::operator[](&local_30,local_84);
      btAlignedObjectArray<float>::operator[](&local_60,local_84);
      bVar9 = operator/((btVector3 *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28->m_floats);
      local_124.m_floats._8_8_ = bVar9.m_floats._8_8_;
      local_124.m_floats._0_8_ = bVar9.m_floats._0_8_;
      in_stack_fffffffffffffd30 =
           btAlignedObjectArray<btSoftBody::Node>::operator[]
                     ((btAlignedObjectArray<btSoftBody::Node> *)(in_RDI + 0x370),local_84);
      btVector3::operator+=(&in_stack_fffffffffffffd30->m_x,&local_124);
    }
  }
  btAlignedObjectArray<float>::~btAlignedObjectArray((btAlignedObjectArray<float> *)0x2788b8);
  btAlignedObjectArray<btVector3>::~btAlignedObjectArray
            ((btAlignedObjectArray<btVector3> *)0x2788c5);
  CProfileSample::~CProfileSample((CProfileSample *)0x2788d2);
  return;
}

Assistant:

void					btSoftBody::applyClusters(bool drift)
{
	BT_PROFILE("ApplyClusters");
//	const btScalar					f0=m_sst.sdt;
	//const btScalar					f1=f0/2;
	btAlignedObjectArray<btVector3> deltas;
	btAlignedObjectArray<btScalar> weights;
	deltas.resize(m_nodes.size(),btVector3(0,0,0));
	weights.resize(m_nodes.size(),0);
	int i;

	if(drift)
	{
		for(i=0;i<m_clusters.size();++i)
		{
			Cluster&	c=*m_clusters[i];
			if(c.m_ndimpulses)
			{
				c.m_dimpulses[0]/=(btScalar)c.m_ndimpulses;
				c.m_dimpulses[1]/=(btScalar)c.m_ndimpulses;
			}
		}
	}
	
	for(i=0;i<m_clusters.size();++i)
	{
		Cluster&	c=*m_clusters[i];	
		if(0<(drift?c.m_ndimpulses:c.m_nvimpulses))
		{
			const btVector3		v=(drift?c.m_dimpulses[0]:c.m_vimpulses[0])*m_sst.sdt;
			const btVector3		w=(drift?c.m_dimpulses[1]:c.m_vimpulses[1])*m_sst.sdt;
			for(int j=0;j<c.m_nodes.size();++j)
			{
				const int			idx=int(c.m_nodes[j]-&m_nodes[0]);
				const btVector3&	x=c.m_nodes[j]->m_x;
				const btScalar		q=c.m_masses[j];
				deltas[idx]		+=	(v+btCross(w,x-c.m_com))*q;
				weights[idx]	+=	q;
			}
		}
	}
	for(i=0;i<deltas.size();++i)
	{
		if(weights[i]>0) 
		{
			m_nodes[i].m_x+=deltas[i]/weights[i];
		}
	}
}